

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.h
# Opt level: O0

void __thiscall
google::protobuf::internal::MicroString::set_inline_size(MicroString *this,size_t size)

{
  bool bVar1;
  LogMessage *pLVar2;
  LogMessage local_30;
  Voidify local_19;
  ulong local_18;
  size_t size_local;
  MicroString *this_local;
  
  local_18 = size << 2;
  size_local = (size_t)this;
  if (0xff < local_18) {
    protobuf_assumption_failed
              ("size <= 0xFF",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string.h"
               ,0x171);
  }
  this->rep_ = (void *)((ulong)this->rep_ & 0xffffffffffffff00 | local_18);
  bVar1 = is_inline(this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string.h"
             ,0x176,"is_inline()");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

void set_inline_size(size_t size) {
    size <<= kTagShift;
    PROTOBUF_ASSUME(size <= 0xFF);
    // Only overwrite the size byte to avoid clobbering the char bytes in case
    // of aliasing.
    rep_ = reinterpret_cast<void*>((reinterpret_cast<uintptr_t>(rep_) & ~0xFF) |
                                   size);
    ABSL_DCHECK(is_inline());
  }